

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

void print<mpt::reference<mpt::metatype>>(void)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  
  iVar3 = mpt::type_properties<mpt::span<const_mpt::reference<mpt::metatype>_>_>::id(true);
  iVar4 = mpt::type_properties<mpt::span<mpt::reference<mpt::metatype>_>_>::id(true);
  bVar1 = mpt::basetype(0x801);
  bVar2 = mpt::basetype((long)iVar3);
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0x801);
  poVar5 = std::operator<<(poVar5,' ');
  poVar5 = std::operator<<(poVar5,'<');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)bVar1);
  poVar5 = std::operator<<(poVar5,'>');
  std::operator<<(poVar5,' ');
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
  poVar5 = std::operator<<(poVar5,' ');
  poVar5 = std::operator<<(poVar5,'<');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)bVar2);
  poVar5 = std::operator<<(poVar5,'>');
  std::operator<<(poVar5,' ');
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void print()
{
	int id = mpt::type_properties<T>::id(true);
	int sid = mpt::type_properties<mpt::span<const T> >::id(true);
	int mid = mpt::type_properties<mpt::span<T> >::id(true);
	int bid = mpt::basetype(id);
	int bsid = mpt::basetype(sid);
	std::cout << id  << ' ' << '<' << bid  << '>' << ' ';
	std::cout << sid << ' ' << '<' << bsid << '>' << ' ';
	std::cout << mid << std::endl;
}